

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_sleep(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RCX;
  int in_ESI;
  __type_conflict2 _Var2;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  CHAR_DATA *in_stack_ffffffffffffff58;
  CHAR_DATA *in_stack_ffffffffffffff60;
  CHAR_DATA *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff94;
  CHAR_DATA *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  
  bVar1 = is_affected_by(in_stack_ffffffffffffff68,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  if (!bVar1) {
    bVar1 = is_npc(in_stack_ffffffffffffff58);
    if (bVar1) {
      in_stack_ffffffffffffff68 = (CHAR_DATA *)in_RCX->act[0];
      _Var2 = std::pow<int,int>(0,0x61a95d);
      if (((ulong)in_stack_ffffffffffffff68 & (long)_Var2) != 0) goto LAB_0061a9e3;
    }
    if (((int)in_RCX->level <= in_ESI + 2) &&
       (bVar1 = saves_spell(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                            in_stack_ffffffffffffff94), !bVar1)) {
      in_stack_ffffffffffffff60 = (CHAR_DATA *)in_RCX->imm_flags[0];
      _Var2 = std::pow<int,int>(0,0x61a9d0);
      if (((ulong)in_stack_ffffffffffffff60 & (long)_Var2) == 0) {
        init_affect((AFFECT_DATA *)0x61aa18);
        std::pow<int,int>(0,0x61aa70);
        affect_join(in_stack_ffffffffffffff60,(AFFECT_DATA *)in_stack_ffffffffffffff58);
        bVar1 = is_awake(in_RCX);
        if (!bVar1) {
          return;
        }
        send_to_char(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        act(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
            in_stack_ffffffffffffff58,0);
        in_RCX->position = 4;
        return;
      }
    }
  }
LAB_0061a9e3:
  act(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
      in_stack_ffffffffffffff58,0);
  return;
}

Assistant:

void spell_sleep(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected_by(victim, AFF_SLEEP)
		|| (is_npc(victim) && IS_SET(victim->act, ACT_UNDEAD))
		|| (level + 2) < victim->level
		|| saves_spell(level - 1, victim, DAM_CHARM)
		|| IS_SET(victim->imm_flags, IMM_SLEEP))
	{
		act("$N resisted your sleep spell.", ch, 0, victim, TO_CHAR);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.level = level;
	af.duration = level / 4;
	af.location = APPLY_NONE;
	af.modifier = 0;

	SET_BIT(af.bitvector, AFF_SLEEP);

	af.mod_name = MOD_CONC;
	affect_join(victim, &af);

	if (is_awake(victim))
	{
		send_to_char("You feel very sleepy ..... zzzzzz.\n\r", victim);
		act("$n goes to sleep.", victim, nullptr, nullptr, TO_ROOM);
		victim->position = POS_SLEEPING;
	}
}